

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lmathlib.c
# Opt level: O3

int math_min(lua_State *L)

{
  int iVar1;
  int iVar2;
  int index2;
  int index1;
  bool bVar3;
  
  iVar1 = lua_gettop(L);
  if (iVar1 < 1) {
    index2 = 1;
    luaL_argerror(L,1,"value expected");
  }
  else {
    index2 = 1;
    if (iVar1 != 1) {
      index1 = 2;
      do {
        iVar2 = lua_compare(L,index1,index2,1);
        if (iVar2 != 0) {
          index2 = index1;
        }
        bVar3 = index1 != iVar1;
        index1 = index1 + 1;
      } while (bVar3);
    }
  }
  lua_pushvalue(L,index2);
  return 1;
}

Assistant:

static int math_min (lua_State *L) {
  int n = lua_gettop(L);  /* number of arguments */
  int imin = 1;  /* index of current minimum value */
  int i;
  luaL_argcheck(L, n >= 1, 1, "value expected");
  for (i = 2; i <= n; i++) {
    if (lua_compare(L, i, imin, LUA_OPLT))
      imin = i;
  }
  lua_pushvalue(L, imin);
  return 1;
}